

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,double kappa,double delta)

{
  double *args_3;
  double dVar1;
  int iVar2;
  double *args_2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  uint local_68;
  int local_64;
  double local_60;
  int local_54;
  long local_50;
  undefined1 local_48 [16];
  
  local_50 = (long)k;
  args_3 = (double *)(*(long *)(this + 0x78) + local_50 * 8);
  dVar9 = *args_3;
  local_48._8_8_ = 0;
  local_48._0_8_ = dVar9;
  local_60 = kappa / (1.0 - kappa) + delta;
  local_68 = r_size;
  local_64 = selected;
  local_54 = k;
  if (selected < 0) {
    args_2 = *(double **)(this + 0x60);
    *args_3 = dVar9 + *args_2 * 0.5;
    fmt_00._M_str = "    selected: {}/{} ({})/2 = pi {}\n";
    fmt_00._M_len = 0x23;
    debug_logger<true>::log<int,int,double,double>
              ((debug_logger<true> *)this,fmt_00,&local_64,(int *)&local_68,args_2,args_3);
    if (local_68 != 0) {
      lVar6 = 8;
      uVar7 = 0;
      do {
        iVar2 = *(int *)(*(long *)(this + 0x60) + lVar6);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
             *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) - local_60;
        dVar9 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                ::local_compute_reduced_cost<baryonyx::bit_array>
                          ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                            *)this,it[iVar2].column,x);
        if (dVar9 <= 0.0) {
          *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
               (dVar9 + *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8)) - local_60;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar7 != local_68);
    }
  }
  else {
    uVar7 = (ulong)(uint)selected;
    lVar6 = *(long *)(this + 0x60);
    dVar1 = *(double *)(lVar6 + uVar7 * 0x10);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    if ((int)(selected + 1U) < r_size) {
      lVar4 = (ulong)(selected + 1U) * 0x10;
      *args_3 = dVar9 + (dVar1 + *(double *)(lVar6 + lVar4)) * 0.5;
      fmt._M_str = "    selected: {}/{} ({}x{})/2 = pi {}\n";
      fmt._M_len = 0x26;
      debug_logger<true>::log<int,int,double,double,double>
                ((debug_logger<true> *)this,fmt,&local_64,(int *)&local_68,
                 (double *)(uVar7 * 0x10 + lVar6),(double *)(lVar6 + lVar4),args_3);
      if (local_64 < 0) {
        uVar5 = 0;
      }
      else {
        lVar6 = -1;
        lVar4 = 8;
        do {
          iVar2 = *(int *)(*(long *)(this + 0x60) + lVar4);
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
          *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
               local_60 + *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8);
          dVar9 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                  ::local_compute_reduced_cost<baryonyx::bit_array>
                            ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                              *)this,it[iVar2].column,x);
          if (0.0 <= dVar9) {
            *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
                 (*(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) - dVar9) +
                 local_60;
          }
          lVar6 = lVar6 + 1;
          lVar4 = lVar4 + 0x10;
        } while (lVar6 < local_64);
        uVar5 = (int)lVar6 + 1;
      }
      if (uVar5 != local_68) {
        uVar8 = (ulong)uVar5;
        uVar7 = uVar8 << 4 | 8;
        do {
          iVar2 = *(int *)(*(long *)(this + 0x60) + uVar7);
          bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
          *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
               *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) - local_60;
          dVar9 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                  ::local_compute_reduced_cost<baryonyx::bit_array>
                            ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                              *)this,it[iVar2].column,x);
          if (dVar9 <= 0.0) {
            *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
                 (dVar9 + *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8)) -
                 local_60;
          }
          uVar8 = uVar8 + 1;
          uVar7 = uVar7 + 0x10;
        } while (uVar8 != local_68);
      }
    }
    else {
      auVar10 = vfmadd132sd_fma(auVar10,local_48,ZEXT816(0x3ff8000000000000));
      *args_3 = auVar10._0_8_;
      fmt_01._M_str = "    selected: {}/{} ({})/2 = pi {}\n";
      fmt_01._M_len = 0x23;
      debug_logger<true>::log<int,int,double,double>
                ((debug_logger<true> *)this,fmt_01,&local_64,(int *)&local_68,
                 (double *)(lVar6 + uVar7 * 0x10),args_3);
      if (local_68 != 0) {
        lVar6 = 8;
        uVar7 = 0;
        do {
          iVar2 = *(int *)(*(long *)(this + 0x60) + lVar6);
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
          *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
               local_60 + *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8);
          dVar9 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                  ::local_compute_reduced_cost<baryonyx::bit_array>
                            ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                              *)this,it[iVar2].column,x);
          if (0.0 <= dVar9) {
            *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
                 (*(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) - dVar9) +
                 local_60;
          }
          uVar7 = uVar7 + 1;
          lVar6 = lVar6 + 0x10;
        } while (uVar7 != local_68);
      }
    }
  }
  bVar3 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                      *)this,local_54,x);
  if (!bVar3) {
    local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>();
  }
  uVar5 = vmovmskpd_avx(local_48);
  return (bool)((byte)((byte)(((ulong)uVar5 << 0x3f) >> 0x38) ^
                      (byte)((ulong)*(undefined8 *)(*(long *)(this + 0x78) + local_50 * 8) >> 0x38))
               >> 7);
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }